

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

uint64_t midr_read(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  
  uVar2 = env->features;
  if (((uint)uVar2 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar3 = env->uncached_cpsr & 0x1f;
      if (uVar3 == 0x10) {
        uVar3 = 0;
      }
      else if (uVar3 == 0x16) {
        uVar3 = 3;
      }
      else if (uVar3 == 0x1a) {
        uVar3 = 2;
      }
      else {
        if ((uVar2 & 0x200000000) != 0) {
          bVar4 = uVar3 == 0x16;
          if (!bVar4) {
            bVar4 = ((env->cp15).scr_el3 & 1) == 0;
          }
          if ((((uint)uVar2 >> 0x1c & 1) == 0) && (uVar3 = 3, bVar4)) goto LAB_00617844;
        }
        uVar3 = 1;
      }
    }
    else {
      uVar3 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar3 = 1;
    if ((env->v7m).exception == 0) {
      uVar3 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_00617844:
  if ((uVar2 & 0x200000000) == 0) {
    bVar4 = false;
  }
  else {
    if (env->aarch64 == 0) {
      bVar4 = (env->uncached_cpsr & 0x1f) == 0x16;
    }
    else {
      bVar4 = (~env->pstate & 0xc) == 0;
    }
    if (!bVar4) {
      bVar4 = ((env->cp15).scr_el3 & 1) == 0;
    }
  }
  if ((((env->features & 0x100000000) != 0) && (!bVar4)) && (uVar3 == 1)) {
    return (env->cp15).vpidr_el2;
  }
  lVar1 = ri->fieldoffset;
  if (lVar1 == 0) {
    __assert_fail("ri->fieldoffset",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                  ,0x2a,"uint64_t raw_read(CPUARMState *, const ARMCPRegInfo *)");
  }
  if ((ri->state != 1) && ((ri->type & 4) == 0)) {
    return (ulong)*(uint *)((long)env->regs + lVar1);
  }
  return *(uint64_t *)((long)env->regs + lVar1);
}

Assistant:

static uint64_t midr_read(CPUARMState *env, const ARMCPRegInfo *ri)
{
    ARMCPU *cpu = env_archcpu(env);
    unsigned int cur_el = arm_current_el(env);
    bool secure = arm_is_secure(env);

    if (arm_feature(&cpu->env, ARM_FEATURE_EL2) && !secure && cur_el == 1) {
        return env->cp15.vpidr_el2;
    }
    return raw_read(env, ri);
}